

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall BpTree<int>::InsertKey(BpTree<int> *this,int k,Addr p)

{
  undefined1 *this_00;
  undefined1 *this_01;
  value_type vVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  int k2;
  undefined1 local_308 [8];
  IndexNode<int> T;
  undefined1 local_298 [8];
  IndexNode<int> D;
  IndexNode<int> B;
  undefined1 local_168 [8];
  IndexNode<int> A;
  int temp;
  Addr Cp;
  undefined1 local_80 [8];
  IndexNode<int> C;
  int i;
  int k_local;
  BpTree<int> *this_local;
  Addr p_local;
  
  C.self.FileOff = k;
  IndexNode<int>::IndexNode((IndexNode<int> *)local_80,this->N);
  if ((this->RootAddr).FileOff == -1) {
    local_80[0] = '1';
    C.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0xffffffffffffffff;
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        &C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    iVar2 = C.self.FileOff;
    *pvVar4 = '1';
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&C,0);
    *pvVar5 = iVar2;
    pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       ((vector<Addr,_std::allocator<Addr>_> *)
                        &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,0);
    pvVar6->BlockNum = p.BlockNum;
    pvVar6->FileOff = p.FileOff;
    InsertNode(this,(IndexNode<int> *)local_80);
    this->RootAddr = C.parent;
    IndexNode<int>::IndexNode((IndexNode<int> *)&Cp.FileOff,(IndexNode<int> *)local_80);
    UpdateBlock(this,(IndexNode<int> *)&Cp.FileOff);
    IndexNode<int>::~IndexNode((IndexNode<int> *)&Cp.FileOff);
    Cp.BlockNum = 1;
  }
  else {
    A.self.BlockNum = FindFirstKey(this,C.self.FileOff,(Addr *)&A.self.FileOff);
    IndexNode<int>::IndexNode((IndexNode<int> *)local_168,this->N);
    FindNode(this,stack0xfffffffffffffefc,(IndexNode<int> *)local_168);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        &A.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(this->N + -2));
    if (*pvVar4 == '0') {
      Insert_Leaf(this,(IndexNode<int> *)local_168,C.self.FileOff,p);
      IndexNode<int>::IndexNode((IndexNode<int> *)&B.self,(IndexNode<int> *)local_168);
      UpdateBlock(this,(IndexNode<int> *)&B.self);
      IndexNode<int>::~IndexNode((IndexNode<int> *)&B.self);
      Cp.BlockNum = 1;
    }
    else {
      InsertNode(this,(IndexNode<int> *)local_80);
      IndexNode<int>::IndexNode((IndexNode<int> *)&D.self,this->N);
      IndexNode<int>::IndexNode((IndexNode<int> *)local_298,this->N);
      FindNode(this,stack0xfffffffffffffefc,(IndexNode<int> *)&D.self);
      T.self = C.parent;
      FindNode(this,C.parent,(IndexNode<int> *)local_298);
      IndexNode<int>::IndexNode((IndexNode<int> *)local_308,(IndexNode<int> *)&D.self);
      Insert_Leaf(this,(IndexNode<int> *)local_308,C.self.FileOff,p);
      for (C.self.BlockNum = 0; C.self.BlockNum < this->N + -1;
          C.self.BlockNum = C.self.BlockNum + 1) {
        pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &B.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)C.self.BlockNum);
        pvVar6->BlockNum = -1;
        pvVar6->FileOff = -1;
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &B.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)C.self.BlockNum);
        *pvVar4 = '0';
      }
      for (C.self.BlockNum = 0; iVar2 = C.self.BlockNum, iVar3 = min_points_nonleaf(this->N),
          iVar2 < iVar3; C.self.BlockNum = C.self.BlockNum + 1) {
        pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)C.self.BlockNum);
        pvVar7 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &B.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)C.self.BlockNum);
        *pvVar7 = *pvVar6;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&T,(long)C.self.BlockNum);
        vVar1 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&B,(long)C.self.BlockNum);
        *pvVar5 = vVar1;
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &B.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)C.self.BlockNum);
        *pvVar4 = '1';
      }
      for (; C.self.BlockNum < this->N; C.self.BlockNum = C.self.BlockNum + 1) {
        pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)C.self.BlockNum);
        iVar2 = C.self.BlockNum;
        iVar3 = min_points_nonleaf(this->N);
        pvVar7 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &D.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)(iVar2 - iVar3));
        *pvVar7 = *pvVar6;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&T,(long)C.self.BlockNum);
        iVar2 = C.self.BlockNum;
        vVar1 = *pvVar5;
        iVar3 = min_points_nonleaf(this->N);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&D,(long)(iVar2 - iVar3));
        iVar2 = C.self.BlockNum;
        *pvVar5 = vVar1;
        iVar3 = min_points_nonleaf(this->N);
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &D.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)(iVar2 - iVar3));
        *pvVar4 = '1';
      }
      local_298[0] = '1';
      this_00 = &B.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
      pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)this_00,(long)(this->N + -1));
      iVar2 = pvVar6->BlockNum;
      this_01 = &D.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
      pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)this_01,(long)(this->N + -1));
      pvVar6->BlockNum = iVar2;
      pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)this_00,(long)(this->N + -1));
      iVar2 = pvVar6->FileOff;
      pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)this_01,(long)(this->N + -1));
      pvVar6->FileOff = iVar2;
      pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)this_00,(long)(this->N + -1));
      pvVar6->BlockNum = D.parent.BlockNum;
      pvVar6->FileOff = D.parent.FileOff;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&D,0);
      Insert_Parent(this,(IndexNode<int> *)&D.self,*pvVar5,(IndexNode<int> *)local_298);
      IndexNode<int>::~IndexNode((IndexNode<int> *)local_308);
      IndexNode<int>::~IndexNode((IndexNode<int> *)local_298);
      IndexNode<int>::~IndexNode((IndexNode<int> *)&D.self);
      Cp.BlockNum = 0;
    }
    IndexNode<int>::~IndexNode((IndexNode<int> *)local_168);
  }
  IndexNode<int>::~IndexNode((IndexNode<int> *)local_80);
  return;
}

Assistant:

void BpTree<K>::InsertKey(K k, Addr p) {
	int i;
	IndexNode<K> C(N);
	if (this->RootAddr.FileOff == -1) {
		C.NodeState = LEAF;		//����
		C.parent = { -1, -1 };
		C.v[0] = '1';		C.k[0] = k;		C.p[0] = p;
		this->InsertNode(C);
		this->RootAddr = C.self;
		this->UpdateBlock(C);
		return;
	}
	Addr Cp;
	int temp = this->FindFirstKey(k, Cp);	//���ǿ���
	IndexNode<K> A(N);
	this->FindNode(Cp, A);
	if (A.v[N-2] == '0') {
		this->Insert_Leaf(A, k, p);		//�п�
		this->UpdateBlock(A);
		return;
	}
	this->InsertNode(C);				//������ˣ�����½��
	IndexNode<K> B(N);
	IndexNode<K> D(N);
	this->FindNode(Cp, B);
	this->FindNode(C.self, D);
	IndexNode<K> T = B;
	this->Insert_Leaf(T, k, p);
	for (i = 0; i < N - 1; i++) {
		B.p[i] = { -1, -1 };			//���B.p[0]��B.p[N - 2]
		B.v[i] = '0';					//���B.v[0]��B.v[N - 2]
	}
	for (i = 0; i < MIN_POINTS_NONLEAF; i++) {		//���¾ɽ��
		B.p[i] = T.p[i];
		B.k[i] = T.k[i];
		B.v[i] = '1';
	}
	for (; i < N; i++) {							//�����½��
		D.p[i - MIN_POINTS_NONLEAF] = T.p[i];
		D.k[i - MIN_POINTS_NONLEAF] = T.k[i];
		D.v[i - MIN_POINTS_NONLEAF] = '1';
	}
	D.NodeState = LEAF;
	D.p[N - 1].BlockNum = B.p[N - 1].BlockNum;	//�½�����ָ���������ϣ����Բ���ԭ������
	D.p[N - 1].FileOff = B.p[N - 1].FileOff;
	
	B.p[N - 1] = D.self;		//�ɽڵ���������������
	K k2 = D.k[0];
	Insert_Parent(B, k2, D);
}